

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::_PathArcToFastEx
          (ImDrawList *this,ImVec2 *center,float radius,int a_min_sample,int a_max_sample,int a_step
          )

{
  ImVec2 IVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int in_ECX;
  int in_EDX;
  float *in_RSI;
  ImVector<ImVec2> *in_RDI;
  int in_R8D;
  float in_XMM0_Da;
  ImVec2 s_2;
  int normalized_max_sample;
  ImVec2 s_1;
  int a_1;
  ImVec2 s;
  int a;
  int sample_index;
  ImVec2 *out_ptr;
  int overstep;
  bool extra_max_sample;
  int samples;
  int a_next_step;
  int sample_range;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  ImDrawList *in_stack_ffffffffffffff98;
  int local_60;
  float local_5c;
  float fStack_58;
  int local_54;
  float local_50;
  float fStack_4c;
  int local_48;
  int local_44;
  ImVec2 *local_40;
  int local_2c;
  int local_20;
  
  if (0.5 <= in_XMM0_Da) {
    local_20 = in_R8D;
    if (in_R8D < 1) {
      iVar3 = _CalcCircleAutoSegmentCount(in_stack_ffffffffffffff98,(float)((ulong)in_RDI >> 0x20));
      local_20 = (int)(0x30 / (long)iVar3);
    }
    iVar3 = ImClamp<int>(local_20,1,0xc);
    iVar4 = ImAbs(in_ECX - in_EDX);
    local_2c = iVar4 + 1;
    bVar2 = false;
    local_20 = iVar3;
    if (1 < iVar3) {
      local_2c = iVar4 / iVar3 + 1;
      if (0 < iVar4 % iVar3) {
        bVar2 = true;
        local_2c = iVar4 / iVar3 + 2;
        if (0 < iVar4) {
          local_20 = iVar3 - (iVar3 - iVar4 % iVar3) / 2;
        }
      }
    }
    ImVector<ImVec2>::resize(in_RDI,in_stack_ffffffffffffff8c);
    local_40 = in_RDI[5].Data + (in_RDI[5].Size - local_2c);
    if (((in_EDX < 0) || (local_44 = in_EDX, 0x2f < in_EDX)) &&
       (local_44 = in_EDX % 0x30, local_44 < 0)) {
      local_44 = local_44 + 0x30;
    }
    local_54 = in_EDX;
    local_48 = in_EDX;
    if (in_ECX < in_EDX) {
      while (in_ECX <= local_54) {
        if (local_44 < 0) {
          local_44 = local_44 + 0x30;
        }
        IVar1 = in_RDI[3].Data[(long)local_44 + 9];
        local_5c = IVar1.x;
        local_40->x = local_5c * in_XMM0_Da + *in_RSI;
        fStack_58 = IVar1.y;
        local_40->y = fStack_58 * in_XMM0_Da + in_RSI[1];
        local_40 = local_40 + 1;
        local_44 = local_44 - local_20;
        local_54 = local_54 - local_20;
        local_20 = iVar3;
      }
    }
    else {
      while (local_48 <= in_ECX) {
        if (0x2f < local_44) {
          local_44 = local_44 + -0x30;
        }
        IVar1 = in_RDI[3].Data[(long)local_44 + 9];
        local_50 = IVar1.x;
        local_40->x = local_50 * in_XMM0_Da + *in_RSI;
        fStack_4c = IVar1.y;
        local_40->y = fStack_4c * in_XMM0_Da + in_RSI[1];
        local_40 = local_40 + 1;
        local_44 = local_20 + local_44;
        local_48 = local_20 + local_48;
        local_20 = iVar3;
      }
    }
    if (bVar2) {
      local_60 = in_ECX % 0x30;
      if (local_60 < 0) {
        local_60 = local_60 + 0x30;
      }
      IVar1 = in_RDI[3].Data[(long)local_60 + 9];
      local_40->x = IVar1.x * in_XMM0_Da + *in_RSI;
      local_40->y = IVar1.y * in_XMM0_Da + in_RSI[1];
    }
  }
  else {
    ImVector<ImVec2>::push_back
              (in_RDI,(ImVec2 *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  }
  return;
}

Assistant:

void ImDrawList::_PathArcToFastEx(const ImVec2& center, float radius, int a_min_sample, int a_max_sample, int a_step)
{
    if (radius < 0.5f)
    {
        _Path.push_back(center);
        return;
    }

    // Calculate arc auto segment step size
    if (a_step <= 0)
        a_step = IM_DRAWLIST_ARCFAST_SAMPLE_MAX / _CalcCircleAutoSegmentCount(radius);

    // Make sure we never do steps larger than one quarter of the circle
    a_step = ImClamp(a_step, 1, IM_DRAWLIST_ARCFAST_TABLE_SIZE / 4);

    const int sample_range = ImAbs(a_max_sample - a_min_sample);
    const int a_next_step = a_step;

    int samples = sample_range + 1;
    bool extra_max_sample = false;
    if (a_step > 1)
    {
        samples            = sample_range / a_step + 1;
        const int overstep = sample_range % a_step;

        if (overstep > 0)
        {
            extra_max_sample = true;
            samples++;

            // When we have overstep to avoid awkwardly looking one long line and one tiny one at the end,
            // distribute first step range evenly between them by reducing first step size.
            if (sample_range > 0)
                a_step -= (a_step - overstep) / 2;
        }
    }

    _Path.resize(_Path.Size + samples);
    ImVec2* out_ptr = _Path.Data + (_Path.Size - samples);

    int sample_index = a_min_sample;
    if (sample_index < 0 || sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
    {
        sample_index = sample_index % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (sample_index < 0)
            sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
    }

    if (a_max_sample >= a_min_sample)
    {
        for (int a = a_min_sample; a <= a_max_sample; a += a_step, sample_index += a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index >= IM_DRAWLIST_ARCFAST_SAMPLE_MAX)
                sample_index -= IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }
    else
    {
        for (int a = a_min_sample; a >= a_max_sample; a -= a_step, sample_index -= a_step, a_step = a_next_step)
        {
            // a_step is clamped to IM_DRAWLIST_ARCFAST_SAMPLE_MAX, so we have guaranteed that it will not wrap over range twice or more
            if (sample_index < 0)
                sample_index += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

            const ImVec2 s = _Data->ArcFastVtx[sample_index];
            out_ptr->x = center.x + s.x * radius;
            out_ptr->y = center.y + s.y * radius;
            out_ptr++;
        }
    }

    if (extra_max_sample)
    {
        int normalized_max_sample = a_max_sample % IM_DRAWLIST_ARCFAST_SAMPLE_MAX;
        if (normalized_max_sample < 0)
            normalized_max_sample += IM_DRAWLIST_ARCFAST_SAMPLE_MAX;

        const ImVec2 s = _Data->ArcFastVtx[normalized_max_sample];
        out_ptr->x = center.x + s.x * radius;
        out_ptr->y = center.y + s.y * radius;
        out_ptr++;
    }

    IM_ASSERT_PARANOID(_Path.Data + _Path.Size == out_ptr);
}